

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O0

uint32_t __thiscall
ans_reorder_fold_decode<2U>::decode_sym
          (ans_reorder_fold_decode<2U> *this,uint64_t *state,uint8_t **in_u8)

{
  uint32_t uVar1;
  reference pvVar2;
  long *in_RDX;
  ulong *in_RSI;
  long in_RDI;
  uint32_t decoded_sym;
  uint32_t *in_ptr_u32;
  value_type *entry;
  size_t thres;
  uint32_t radix;
  uint8_t **in_u8_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  
  uVar3 = 8;
  in_u8_00 = (uint8_t **)0x200;
  pvVar2 = std::vector<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>::operator[]
                     ((vector<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_> *)
                      (in_RDI + 0x38),*in_RSI & *(ulong *)(in_RDI + 0x20));
  *in_RSI = (ulong)pvVar2->freq * (*in_RSI >> ((byte)*(undefined8 *)(in_RDI + 0x28) & 0x3f)) +
            (ulong)pvVar2->offset;
  if (*in_RSI < *(ulong *)(in_RDI + 0x30)) {
    *in_RDX = *in_RDX + -4;
    *in_RSI = *in_RSI << 0x20 | (ulong)*(uint *)*in_RDX;
  }
  uVar1 = ans_reorder_fold_undo_mapping
                    ((dec_entry_reorder_fold *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),in_u8_00);
  return uVar1 - 0x200;
}

Assistant:

uint32_t decode_sym(uint64_t& state, const uint8_t*& in_u8)
    {
        const uint32_t radix = 8;
        const size_t thres = 1 << (fidelity + radix - 1);
        const auto& entry = table[state & frame_mask];
        state = uint64_t(entry.freq) * (state >> frame_log2)
            + uint64_t(entry.offset);
        if (state < lower_bound) {
            in_u8 -= sizeof(uint32_t);
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
            state = state << constants::RADIX_LOG2 | uint64_t(*in_ptr_u32);
        }
        auto decoded_sym = ans_reorder_fold_undo_mapping(entry, in_u8);
        return decoded_sym - thres;
    }